

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O2

void basic_suite::fail_nil(void)

{
  char input [4];
  decoder_type decoder;
  undefined4 local_154;
  value local_150;
  value_type local_14c [4];
  basic_decoder<char> local_148;
  
  builtin_memcpy(local_14c,"nil",4);
  trial::protocol::json::detail::basic_decoder<char>::basic_decoder<4ul>(&local_148,&local_14c);
  local_150 = local_148.current.code;
  local_154 = 0xffffffff;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::error_unexpected_token",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0xf9,"void basic_suite::fail_nil()",&local_150,&local_154);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::core::detail::span<char>,char[1]>
            ("decoder.literal()","\"\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0xfa,"void basic_suite::fail_nil()",&local_148.current.view,"");
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::core::detail::span<char>,char[4]>
            ("decoder.tail()","\"nil\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0xfb,"void basic_suite::fail_nil()",&local_148,"nil");
  return;
}

Assistant:

void fail_nil()
{
    const char input[] = "nil";
    decoder_type decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::error_unexpected_token);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.literal(), "");
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.tail(), "nil");
}